

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpDebugOut.c
# Opt level: O2

void exitProcess(void)

{
  fflush((FILE *)0x0);
  raise(9);
  return;
}

Assistant:

static void exitProcess (void)
{
#if (DE_OS == DE_OS_IOS)
	/* Since tests are in the same process as execserver, we want to give it
	   a chance to stream complete log data before terminating. */
	deSleep(5000);
#endif

#if defined(QP_USE_SIGNAL_HANDLER)
	/* QP_USE_SIGNAL_HANDLER defined, this means this function could have
	   been called from a signal handler. Calling exit() inside a signal
	   handler is not safe. */

	/* Flush all open FILES */
	fflush(DE_NULL);

	/* Kill without calling any _at_exit handlers as those might hang */
	raise(SIGKILL);
#else
	exit(-1);
#endif
}